

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::internal::PrintColorEncoded(char *str)

{
  char cVar1;
  uint uVar2;
  char *__end;
  undefined8 uVar3;
  allocator<char> *in_RDI;
  char ch;
  char *p;
  GTestColor color;
  allocator<char> *__a;
  allocator<char> *__beg;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  allocator<char> local_39;
  string local_38 [32];
  char *local_18;
  uint local_c;
  allocator<char> *local_8;
  
  local_c = 0;
  local_8 = in_RDI;
  while (__end = strchr((char *)local_8,0x40), uVar2 = local_c, local_18 = __end,
        __end != (char *)0x0) {
    __beg = &local_39;
    __a = local_8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),(char *)__beg,__end,__a
              );
    uVar3 = std::__cxx11::string::c_str();
    ColoredPrintf((GTestColor)(ulong)uVar2,"%s",uVar3);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator(&local_39);
    cVar1 = local_18[1];
    in_stack_ffffffffffffffb0 = CONCAT13(cVar1,(int3)in_stack_ffffffffffffffb0);
    local_8 = (allocator<char> *)(local_18 + 2);
    if (cVar1 == '@') {
      ColoredPrintf((GTestColor)(ulong)local_c,"@");
    }
    else if (cVar1 == 'D') {
      local_c = 0;
    }
    else if (cVar1 == 'R') {
      local_c = 1;
    }
    else if (cVar1 == 'G') {
      local_c = 2;
    }
    else if (cVar1 == 'Y') {
      local_c = 3;
    }
    else {
      local_8 = (allocator<char> *)(local_18 + 1);
    }
  }
  ColoredPrintf((GTestColor)(ulong)local_c,"%s",local_8);
  return;
}

Assistant:

static void PrintColorEncoded(const char* str) {
  GTestColor color = COLOR_DEFAULT;  // The current color.

  // Conceptually, we split the string into segments divided by escape
  // sequences.  Then we print one segment at a time.  At the end of
  // each iteration, the str pointer advances to the beginning of the
  // next segment.
  for (;;) {
    const char* p = strchr(str, '@');
    if (p == NULL) {
      ColoredPrintf(color, "%s", str);
      return;
    }

    ColoredPrintf(color, "%s", std::string(str, p).c_str());

    const char ch = p[1];
    str = p + 2;
    if (ch == '@') {
      ColoredPrintf(color, "@");
    } else if (ch == 'D') {
      color = COLOR_DEFAULT;
    } else if (ch == 'R') {
      color = COLOR_RED;
    } else if (ch == 'G') {
      color = COLOR_GREEN;
    } else if (ch == 'Y') {
      color = COLOR_YELLOW;
    } else {
      --str;
    }
  }
}